

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_byte_string(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                   *this,byte_string_type *v,error_code *ec)

{
  byte bVar1;
  pointer puVar2;
  byte *pbVar3;
  pointer pvVar4;
  pointer puVar5;
  cbor_errc __e;
  size_t sVar6;
  type_conflict2 tVar7;
  assertion_error *this_00;
  int iVar8;
  bool bVar9;
  allocator_type local_81;
  byte_string_type *local_80;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *local_78;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  puVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pbVar3 = (this->source_).current_.p_;
  if (pbVar3 != (this->source_).end_.p_) {
    bVar1 = *pbVar3;
    if ((bVar1 & 0xe0) != 0x40) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,
                 "assertion \'major_type == jsoncons::cbor::detail::cbor_major_type::byte_string\' failed at  <> :0"
                 ,(allocator<char> *)&local_81);
      assertion_error::assertion_error(this_00,(string *)local_70);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_78 = &this->source_;
    local_80 = v;
    if ((~bVar1 & 0x1f) == 0) {
      bVar9 = false;
      iVar8 = 0;
LAB_0025dc60:
      do {
        if (bVar9) {
          return;
        }
        pbVar3 = (this->source_).current_.p_;
        if (pbVar3 == (this->source_).end_.p_) {
          __e = unexpected_eof;
LAB_0025ddff:
          std::error_code::operator=(ec,__e);
          this->more_ = false;
          return;
        }
        bVar1 = *pbVar3;
        if (bVar1 == 0xff && 0 < iVar8) {
          iVar8 = iVar8 + -1;
          bVar9 = iVar8 == 0;
          binary_iterator_source<(anonymous_namespace)::MyIterator>::ignore(local_78,(size_t)v);
          goto LAB_0025dc60;
        }
        if ((bVar1 & 0xe0) != 0x40) {
          __e = illegal_chunked_string;
          goto LAB_0025ddff;
        }
        if ((~bVar1 & 0x1f) == 0) goto LAB_0025dd10;
        sVar6 = get_size(this,ec);
        if (ec->_M_value != 0) {
          return;
        }
        v = local_80;
        tVar7 = source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>::
                read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          (local_78,local_80,sVar6);
        if (tVar7 != sVar6) {
          v = (byte_string_type *)0x1;
          std::error_code::operator=(ec,unexpected_eof);
        }
        this->more_ = tVar7 == sVar6;
        bVar9 = iVar8 == 0;
        if (ec->_M_value != 0) {
          return;
        }
      } while( true );
    }
    sVar6 = get_size(this,ec);
    if (ec->_M_value == 0) {
      tVar7 = source_reader<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>>::
              read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        (local_78,local_80,sVar6);
      if (tVar7 != sVar6) goto LAB_0025dde0;
      pvVar4 = (this->stringref_map_stack_).
               super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((this->stringref_map_stack_).
           super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != pvVar4) &&
         (puVar2 = (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
         puVar5 = (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start,
         sVar6 = detail::min_length_for_stringref
                           ((long)pvVar4[-1].
                                  super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)pvVar4[-1].
                                  super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 6),
         sVar6 <= (ulong)((long)puVar2 - (long)puVar5))) {
        pvVar4 = (this->stringref_map_stack_).
                 super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>::mapped_string>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_70[0] = (string)0x2;
        local_70._8_8_ = &local_58;
        local_70._16_8_ = 0;
        local_58._M_local_buf[0] = '\0';
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_48,local_80,&local_81);
        std::
        vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>>
        ::
        emplace_back<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>
                  ((vector<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string,std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,std::allocator<char>>::mapped_string>>
                    *)(pvVar4 + -1),(mapped_string *)local_70);
        mapped_string::~mapped_string((mapped_string *)local_70);
      }
    }
    return;
  }
LAB_0025dde0:
  std::error_code::operator=(ec,unexpected_eof);
  return;
LAB_0025dd10:
  iVar8 = iVar8 + 1;
  binary_iterator_source<(anonymous_namespace)::MyIterator>::ignore(local_78,(size_t)v);
  bVar9 = false;
  goto LAB_0025dc60;
}

Assistant:

void read_byte_string(byte_string_type& v, std::error_code& ec)
    {
        v.clear();
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        JSONCONS_ASSERT(major_type == jsoncons::cbor::detail::cbor_major_type::byte_string);

        switch(info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                auto func = [&v](Source& source, std::size_t length, std::error_code& ec) -> bool
                {
                    if (source_reader<Source>::read(source, v, length) != length)
                    {
                        ec = cbor_errc::unexpected_eof;
                        return false;
                    }
                    return true;
                };
                iterate_string_chunks(func, major_type, ec);
                break;
            }
            default:
            {
                std::size_t length = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (source_reader<Source>::read(source_, v, length) != length)
                {
                    ec = cbor_errc::unexpected_eof;
                    return;
                }
                if (!stringref_map_stack_.empty() &&
                    v.size() >= jsoncons::cbor::detail::min_length_for_stringref(stringref_map_stack_.back().size()))
                {
                    stringref_map_stack_.back().emplace_back(mapped_string(v, alloc_));
                }
                break;
            }

        }
    }